

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_store(CFL_CTX *cfl,uint8_t *input,int input_stride,int row,int col,TX_SIZE tx_size,
              int use_hbd)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  cfl_subsample_hbd_fn UNRECOVERED_JUMPTABLE;
  _func_cfl_subsample_hbd_fn_TX_SIZE **pp_Var4;
  _func_cfl_subsample_lbd_fn_TX_SIZE **pp_Var5;
  int iVar6;
  undefined7 in_register_00000089;
  int iVar7;
  int iVar8;
  int iVar9;
  
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000089,tx_size) * 4);
  iVar1 = cfl->subsampling_y;
  iVar7 = row << (2 - (byte)iVar1 & 0x1f);
  iVar2 = cfl->subsampling_x;
  iVar8 = col << (2 - (byte)iVar2 & 0x1f);
  iVar6 = *(int *)((long)tx_size_high + uVar3) >> ((byte)iVar1 & 0x1f);
  iVar9 = *(int *)((long)tx_size_wide + uVar3) >> ((byte)iVar2 & 0x1f);
  cfl->are_parameters_computed = 0;
  if (col == 0 && row == 0) {
    cfl->buf_width = iVar9;
  }
  else {
    iVar9 = iVar9 + iVar8;
    if (iVar9 <= cfl->buf_width) {
      iVar9 = cfl->buf_width;
    }
    cfl->buf_width = iVar9;
    iVar6 = iVar6 + iVar7;
    if (iVar6 <= cfl->buf_height) {
      iVar6 = cfl->buf_height;
    }
  }
  cfl->buf_height = iVar6;
  if (use_hbd == 0) {
    if (iVar1 == 1) {
      pp_Var5 = &cfl_get_luma_subsampling_420_lbd;
    }
    else {
      pp_Var5 = &cfl_get_luma_subsampling_422_lbd;
    }
    if (iVar2 != 1) {
      pp_Var5 = &cfl_get_luma_subsampling_444_lbd;
    }
    UNRECOVERED_JUMPTABLE = (cfl_subsample_hbd_fn)(**pp_Var5)(tx_size);
  }
  else {
    if (iVar1 == 1) {
      pp_Var4 = &cfl_get_luma_subsampling_420_hbd;
    }
    else {
      pp_Var4 = &cfl_get_luma_subsampling_422_hbd;
    }
    if (iVar2 != 1) {
      pp_Var4 = &cfl_get_luma_subsampling_444_hbd;
    }
    UNRECOVERED_JUMPTABLE = (**pp_Var4)(tx_size);
    input = (uint8_t *)((long)input * 2);
  }
  (*UNRECOVERED_JUMPTABLE)
            ((uint16_t *)input,input_stride,cfl->recon_buf_q3 + (iVar7 * 0x20 + iVar8));
  return;
}

Assistant:

static void cfl_store(CFL_CTX *cfl, const uint8_t *input, int input_stride,
                      int row, int col, TX_SIZE tx_size, int use_hbd) {
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const int tx_off_log2 = MI_SIZE_LOG2;
  const int sub_x = cfl->subsampling_x;
  const int sub_y = cfl->subsampling_y;
  const int store_row = row << (tx_off_log2 - sub_y);
  const int store_col = col << (tx_off_log2 - sub_x);
  const int store_height = height >> sub_y;
  const int store_width = width >> sub_x;

  // Invalidate current parameters
  cfl->are_parameters_computed = 0;

  // Store the surface of the pixel buffer that was written to, this way we
  // can manage chroma overrun (e.g. when the chroma surfaces goes beyond the
  // frame boundary)
  if (col == 0 && row == 0) {
    cfl->buf_width = store_width;
    cfl->buf_height = store_height;
  } else {
    cfl->buf_width = OD_MAXI(store_col + store_width, cfl->buf_width);
    cfl->buf_height = OD_MAXI(store_row + store_height, cfl->buf_height);
  }

  // Check that we will remain inside the pixel buffer.
  assert(store_row + store_height <= CFL_BUF_LINE);
  assert(store_col + store_width <= CFL_BUF_LINE);

  // Store the input into the CfL pixel buffer
  uint16_t *recon_buf_q3 =
      cfl->recon_buf_q3 + (store_row * CFL_BUF_LINE + store_col);
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    cfl_subsampling_hbd(tx_size, sub_x, sub_y)(CONVERT_TO_SHORTPTR(input),
                                               input_stride, recon_buf_q3);
  } else {
    cfl_subsampling_lbd(tx_size, sub_x, sub_y)(input, input_stride,
                                               recon_buf_q3);
  }
#else
  (void)use_hbd;
  cfl_subsampling_lbd(tx_size, sub_x, sub_y)(input, input_stride, recon_buf_q3);
#endif
}